

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyFullClassName<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc,Options *options)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  string *extraout_RAX;
  string *psVar4;
  size_type *psVar5;
  string classname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string php_namespace;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  string local_38;
  
  LegacyGeneratedClassName<google::protobuf::EnumDescriptor>((string *)local_78,desc);
  uVar1._0_1_ = options->is_descriptor;
  uVar1._1_1_ = options->aggregate_metadata;
  uVar1._2_1_ = options->gen_c_wkt;
  uVar1._3_1_ = options->field_0x3;
  RootPhpNamespace<google::protobuf::EnumDescriptor>
            (&local_38,*(EnumDescriptor **)(desc + 0x10),(Options *)(ulong)uVar1);
  if (local_38._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((string *)local_78._0_8_ == (string *)(local_78 + 0x10)) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78._17_7_,local_78[0x10]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78._24_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_78._17_7_,local_78[0x10]);
    }
    __return_storage_ptr__->_M_string_length = local_78._8_8_;
    local_78._8_8_ = 0;
    local_78[0x10] = '\0';
    local_78._0_8_ = (string *)(local_78 + 0x10);
  }
  else {
    local_58._M_allocated_capacity = (size_type)local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_38._M_dataplus._M_p,
               local_38._M_dataplus._M_p + local_38._M_string_length);
    std::__cxx11::string::append(local_58._M_local_buf);
    plVar3 = (long *)std::__cxx11::string::_M_append(local_58._M_local_buf,local_78._0_8_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar2 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((undefined1 *)local_58._M_allocated_capacity != local_48) {
      operator_delete((void *)local_58._M_allocated_capacity);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  psVar4 = (string *)(local_78 + 0x10);
  if ((string *)local_78._0_8_ != psVar4) {
    operator_delete((void *)local_78._0_8_);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string LegacyFullClassName(const DescriptorType* desc,
                                const Options& options) {
  std::string classname = LegacyGeneratedClassName(desc);
  std::string php_namespace = RootPhpNamespace(desc, options);
  if (!php_namespace.empty()) {
    return php_namespace + "\\" + classname;
  }
  return classname;
}